

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::UnsafeArenaSwap
          (RepeatedField<absl::lts_20250127::Cord> *this,
          RepeatedField<absl::lts_20250127::Cord> *other)

{
  Arena *v1;
  Arena *v2;
  HeapRep *pHVar1;
  Nonnull<const_char_*> pcVar2;
  
  if (this == other) {
    return;
  }
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    v1 = internal::SooRep::soo_arena(&this->soo_rep_);
  }
  else {
    pHVar1 = heap_rep(this);
    v1 = (pHVar1->field_0).arena;
  }
  if ((undefined1  [16])((undefined1  [16])(other->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    v2 = internal::SooRep::soo_arena(&other->soo_rep_);
  }
  else {
    pHVar1 = heap_rep(other);
    v2 = (pHVar1->field_0).arena;
  }
  if (v1 == v2) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (v1,v2,"GetArena() == other->GetArena()");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    InternalSwap(this,other);
    return;
  }
  UnsafeArenaSwap();
}

Assistant:

void RepeatedField<Element>::UnsafeArenaSwap(RepeatedField* other) {
  if (this == other) return;
  ABSL_DCHECK_EQ(GetArena(), other->GetArena());
  InternalSwap(other);
}